

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_propdef
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  vm_datatype_t vVar4;
  undefined4 uVar5;
  bool bVar6;
  vm_obj_id_t source_obj;
  vm_val_t val;
  
  if (in_argc == (uint *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = 1 < *in_argc;
  }
  if ((getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
      ) && (iVar2 = __cxa_guard_acquire(&getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                         ::desc), iVar2 != 0)) {
    getp_propdef::desc.min_argc_ = 1;
    getp_propdef::desc.opt_argc_ = 1;
    getp_propdef::desc.varargs_ = 0;
    __cxa_guard_release(&getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar2 = get_prop_check_argc(retval,in_argc,&getp_propdef::desc);
  if (iVar2 != 0) {
    return 1;
  }
  CVmRun::pop_prop(&G_interpreter_X,&val);
  uVar1 = val.val.prop;
  if (bVar6) {
    CVmRun::pop_int(&G_interpreter_X,&val);
    uVar5 = val.val.obj;
  }
  else {
    uVar5 = 1;
  }
  source_obj = 0;
  iVar2 = (*this->_vptr_CVmObject[0xd])(this,(ulong)(ushort)uVar1,&val,self,&source_obj,0);
  if ((iVar2 != 0) && (iVar3 = CVmObjIntClsMod::is_intcls_mod_obj(source_obj), iVar3 != 0)) {
    source_obj = (*this->_vptr_CVmObject[0x3a])(this,self,(ulong)source_obj);
  }
  switch(uVar5) {
  case 1:
    vVar4 = VM_TRUE - (iVar2 == 0);
    goto LAB_00296194;
  case 2:
    bVar6 = source_obj == self;
    break;
  case 3:
    bVar6 = source_obj != self;
    break;
  case 4:
    if (iVar2 != 0) {
      if (source_obj != 0) {
        self = source_obj;
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      return 1;
    }
    retval->typ = VM_NIL;
    return 1;
  default:
    err_throw(0x902);
  }
  vVar4 = (byte)(bVar6 & iVar2 != 0) + VM_NIL;
LAB_00296194:
  retval->typ = vVar4;
  return 1;
}

Assistant:

int CVmObject::getp_propdef(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1, 1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 2)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = get_prop(vmg_ prop, &val, self, &source_obj, 0);

    /* 
     *   If we found a result, check to see if it's an intrinsic class
     *   modifier object.  If it is, replace it with its intrinsic class:
     *   modifier objects are invisible through the reflection mechanism, and
     *   appear to be the actual intrinsic classes they modify.  
     */
    if (found && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ source_obj))
        source_obj = find_intcls_for_mod(vmg_ self, source_obj);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_DIRECTLY:
        /* return true if the property is defined directly */
        retval->set_logical(found && source_obj == self);
        break;
        
    case VMOBJ_PROPDEF_INHERITS:
        /* return true if the property is inherited only */
        retval->set_logical(found && source_obj != self);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* 
             *   If we got a valid source object, return it.  If we didn't
             *   get a valid source object, but we found the property,
             *   return 'self' as the result; this isn't exactly right, but
             *   this should only be possible when the source object is an
             *   intrinsic class for which no intrinsic class object is
             *   defined, in which case the best we can do is provide 'self'
             *   as the answer.  
             */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }